

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O0

void async_simple::coro::syncAwait<async_simple::coro::Lazy<void>>(Lazy<void> *lazy)

{
  Executor *this;
  Try<void> value;
  Condition cond;
  Executor *executor;
  counting_semaphore<1L> *in_stack_ffffffffffffffa8;
  Try<void> *this_00;
  char *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  type_conflict2 *in_stack_ffffffffffffffe8;
  
  this = detail::LazyBase<void,_false>::getExecutor((LazyBase<void,_false> *)0x436043);
  if (this != (Executor *)0x0) {
    (*this->_vptr_Executor[3])();
    logicAssert((bool)in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8);
  }
  this_00 = (Try<void> *)&stack0xffffffffffffffec;
  util::Condition::Condition((Condition *)this_00,(ptrdiff_t)in_stack_ffffffffffffffa8);
  Try<void>::Try((Try<void> *)0x436091);
  detail::LazyBase<void,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<void,_false> *)this,in_stack_ffffffffffffffe8);
  std::counting_semaphore<1L>::acquire(in_stack_ffffffffffffffa8);
  Try<void>::value(this_00);
  Try<void>::~Try((Try<void> *)0x4360d6);
  return;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}